

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

void xmlCatalogCleanup(void)

{
  xmlRMutexLock(&xmlCatalogMutex);
  if (xmlDebugCatalogs != 0) {
    xmlCatalogPrintDebug("Catalogs cleanup\n");
  }
  if (xmlCatalogXMLFiles != (xmlHashTablePtr)0x0) {
    xmlHashFree(xmlCatalogXMLFiles,xmlFreeCatalogHashEntryList);
  }
  xmlCatalogXMLFiles = (xmlHashTablePtr)0x0;
  if (xmlDefaultCatalog != (xmlCatalogPtr)0x0) {
    xmlFreeCatalog(xmlDefaultCatalog);
  }
  xmlDefaultCatalog = (xmlCatalogPtr)0x0;
  xmlDebugCatalogs = 0;
  xmlCatalogInitialized = 0;
  xmlRMutexUnlock(&xmlCatalogMutex);
  return;
}

Assistant:

void
xmlCatalogCleanup(void) {
    xmlRMutexLock(&xmlCatalogMutex);
    if (xmlDebugCatalogs)
	xmlCatalogPrintDebug(
		"Catalogs cleanup\n");
    if (xmlCatalogXMLFiles != NULL)
	xmlHashFree(xmlCatalogXMLFiles, xmlFreeCatalogHashEntryList);
    xmlCatalogXMLFiles = NULL;
    if (xmlDefaultCatalog != NULL)
	xmlFreeCatalog(xmlDefaultCatalog);
    xmlDefaultCatalog = NULL;
    xmlDebugCatalogs = 0;
    xmlCatalogInitialized = 0;
    xmlRMutexUnlock(&xmlCatalogMutex);
}